

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

void arrangeQuoters_superFast_iVar5
               (uint *pInOut,uint *temp,int start,int iQ,int jQ,int kQ,int lQ,char *pCanonPerm,
               uint *pCanonPhase)

{
  uint *local_40;
  uint *tempPtr;
  int shiftSize;
  int blockSize;
  int i;
  int kQ_local;
  int jQ_local;
  int iQ_local;
  int start_local;
  uint *temp_local;
  uint *pInOut_local;
  
  local_40 = temp + start;
  if ((iQ != 0) || (jQ != 1)) {
    for (shiftSize = start + -1; 0 < shiftSize; shiftSize = shiftSize + -4) {
      memcpy(local_40 + -1,pInOut + ((long)shiftSize - (long)iQ),4);
      memcpy(local_40 + -2,pInOut + ((long)shiftSize - (long)jQ),4);
      memcpy(local_40 + -3,pInOut + ((long)shiftSize - (long)kQ),4);
      local_40 = local_40 + -4;
      memcpy(local_40,pInOut + ((long)shiftSize - (long)lQ),4);
    }
    memcpy(pInOut,temp,(long)start << 2);
    updataInfo(iQ,jQ,5,pCanonPerm,pCanonPhase);
  }
  return;
}

Assistant:

void arrangeQuoters_superFast_iVar5(unsigned* pInOut, unsigned* temp, int start,  int iQ, int jQ, int kQ, int lQ, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i,blockSize,shiftSize;
    unsigned* tempPtr = temp+start;
//     printf("in arrangeQuoters_superFast_iVar5\n");

    if(iQ == 0 && jQ == 1)
        return; 
    blockSize = sizeof(unsigned);
    shiftSize = 4;
    for(i=start-1;i>0;i-=shiftSize)
    {       
        tempPtr -= 1;       
        memcpy(tempPtr, pInOut+i-iQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-jQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-kQ, blockSize);
        tempPtr -= 1;
        memcpy(tempPtr, pInOut+i-lQ, blockSize);        
    }   
    memcpy(pInOut, temp, start*sizeof(unsigned));
    updataInfo(iQ, jQ, 5, pCanonPerm, pCanonPhase);
}